

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O2

QPixmapStylePrivate * __thiscall
QPixmapStylePrivate::getCachedPixmap
          (QPixmapStylePrivate *this,ControlDescriptor control,QPixmapStyleDescriptor *desc,
          QSize *size)

{
  undefined8 *puVar1;
  char cVar2;
  char *s;
  undefined4 in_register_00000034;
  int *in_R8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_148;
  QLatin1String local_128;
  QStringBuilder<QLatin1String,_QString> local_118;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  undefined1 local_a8 [16];
  QArrayDataPointer<char16_t> local_98;
  char16_t local_80;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = *(undefined8 **)(CONCAT44(in_register_00000034,control) + 8);
  local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::number((int)&local_118,*in_R8);
  local_98.d = local_118.b.d.d;
  local_a8._8_8_ = local_118.a.m_data;
  local_a8._0_8_ = local_118.a.m_size;
  local_118.a.m_size = 0;
  local_118.a.m_data = (char *)0x0;
  local_118.b.d.d = (Data *)0x0;
  local_98.ptr._0_2_ = L'*';
  QString::number((int)&local_e8,in_R8[1]);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::QStringBuilder
            (&local_78,(QStringBuilder<QString,_char16_t> *)local_a8,(QString *)&local_e8);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
            ((QString *)&local_c8,&local_78);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_118);
  local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d._0_4_ = 0xaaaaaaaa;
  local_e8.d._4_4_ = 0xaaaaaaaa;
  local_e8.ptr._0_4_ = 0xaaaaaaaa;
  local_e8.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)*puVar1)(puVar1);
  s = (char *)QMetaObject::className();
  QLatin1String::QLatin1String(&local_128,s);
  QString::number((int)&local_148,(int)desc);
  local_118.b.d.size = local_148.size;
  local_118.b.d.ptr = local_148.ptr;
  local_118.b.d.d = local_148.d;
  local_118.a.m_size = local_128.m_size;
  local_118.a.m_data = local_128.m_data;
  local_148.d = (Data *)0x0;
  local_148.ptr = (char16_t *)0x0;
  local_148.size = 0;
  QStringBuilder<QLatin1String,_QString>::QStringBuilder
            ((QStringBuilder<QLatin1String,_QString> *)local_a8,&local_118);
  local_80 = L'@';
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::QStringBuilder
            ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)&local_78,
             (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)local_a8);
  local_78.b.d.size = (qsizetype)&local_c8;
  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>,_const_QString_&>
  ::convertTo<QString>
            ((QString *)&local_e8,
             (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>,_const_QString_&>
              *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&local_78.a.a.d.size);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
  *(undefined1 **)&(this->super_QCommonStylePrivate).super_QStylePrivate.field_0x10 =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QCommonStylePrivate).super_QStylePrivate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QCommonStylePrivate).super_QStylePrivate.field_0x8 =
       &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)this);
  cVar2 = QPixmapCache::find((QString *)&local_e8,(QPixmap *)this);
  if (cVar2 == '\0') {
    local_78.a.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.a.a.d.d._0_4_ = 0xaaaaaaaa;
    local_78.a.a.d.d._4_4_ = 0xaaaaaaaa;
    local_78.a.a.d.ptr._0_4_ = 0xaaaaaaaa;
    local_78.a.a.d.ptr._4_4_ = 0xaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)&local_78,size,0,0);
    scale((QPixmapStylePrivate *)local_a8,*in_R8,in_R8[1],(QPixmap *)&local_78,
          (QPixmapStyleDescriptor *)size);
    QPixmap::operator=((QPixmap *)this,(QPixmap *)local_a8);
    QPixmap::~QPixmap((QPixmap *)local_a8);
    QPixmapCache::insert((QString *)&local_e8,(QPixmap *)this);
    QPixmap::~QPixmap((QPixmap *)&local_78);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QPixmapStylePrivate::getCachedPixmap(QPixmapStyle::ControlDescriptor control,
                                             const QPixmapStyleDescriptor &desc,
                                             const QSize &size) const
{
    Q_Q(const QPixmapStyle);

    const QString sizeString = QString::number(size.width()) % u'*'
            % QString::number(size.height());
    const QString key = QLatin1StringView(q->metaObject()->className()) % QString::number(control)
            % u'@' % sizeString;

    QPixmap result;

    if (!QPixmapCache::find( key, &result)) {
        QPixmap source(desc.fileName);
        result = scale(size.width(), size.height(), source, desc);
        QPixmapCache::insert(key, result);
    }
    return result;
}